

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlugIn.cpp
# Opt level: O1

void OpenSteer::PlugIn::sortBySelectionOrder(void)

{
  PlugIn *pPVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  
  if (1 < itemsInRegistry) {
    lVar2 = 1;
    lVar4 = 0;
    do {
      lVar5 = lVar4 + 1;
      lVar3 = lVar2;
      if (lVar5 < itemsInRegistry) {
        do {
          (*(registry[lVar4]->super_AbstractPlugIn)._vptr_AbstractPlugIn[8])();
          (*(registry[lVar3]->super_AbstractPlugIn)._vptr_AbstractPlugIn[8])();
          if (extraout_XMM0_Da_00 < extraout_XMM0_Da) {
            pPVar1 = registry[lVar4];
            registry[lVar4] = registry[lVar3];
            registry[lVar3] = pPVar1;
          }
          lVar3 = lVar3 + 1;
        } while ((int)lVar3 < itemsInRegistry);
      }
      lVar2 = lVar2 + 1;
      lVar4 = lVar5;
    } while (lVar5 < (long)itemsInRegistry + -1);
  }
  return;
}

Assistant:

void 
OpenSteer::PlugIn::sortBySelectionOrder (void)
{
    // I know, I know, just what the world needs:
    // another inline shell sort implementation...

    // starting at each of the first n-1 elements of the array
    for (int i = 0; i < itemsInRegistry-1; i++)
    {
        // scan over subsequent pairs, swapping if larger value is first
        for (int j = i+1; j < itemsInRegistry; j++)
        {
            const float iKey = registry[i]->selectionOrderSortKey ();
            const float jKey = registry[j]->selectionOrderSortKey ();

            if (iKey > jKey)
            {
                PlugIn* temporary = registry[i];
                registry[i] = registry[j];
                registry[j] = temporary;
            }
        }
    }
}